

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_prop
                   (string *__return_storage_ptr__,Property *prop,string *prop_name,uint32_t indent)

{
  bool bVar1;
  Variability VVar2;
  Attribute *this;
  AttrMeta *pAVar3;
  value *this_00;
  Attribute *pAVar4;
  PrimVar *pPVar5;
  TimeSamples *this_01;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this_02;
  size_type sVar6;
  const_reference v;
  ostream *poVar7;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  undefined1 in_R8B;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_358 [8];
  string ty_2;
  string local_318;
  string local_2f8;
  string local_2d8 [8];
  string ty_1;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218 [8];
  string ty;
  Attribute *attr;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *prop_name_local;
  Property *prop_local;
  
  local_24 = indent;
  psStack_20 = prop_name;
  prop_name_local = (string *)prop;
  prop_local = (Property *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = Property::is_relationship((Property *)prop_name_local);
  if (bVar1) {
    print_rel_prop((string *)&attr,(Property *)prop_name_local,psStack_20,local_24);
    ::std::operator<<(aoStack_1a0,(string *)&attr);
    ::std::__cxx11::string::~string((string *)&attr);
  }
  else {
    bVar1 = Property::is_attribute((Property *)prop_name_local);
    if (bVar1) {
      this = Property::get_attribute((Property *)prop_name_local);
      pAVar3 = Attribute::metas(this);
      bVar1 = AttrMetas::authored(pAVar3);
      n = extraout_EDX;
      if ((bVar1) || (bVar1 = Attribute::has_value(this), n = extraout_EDX_00, bVar1)) {
        pprint::Indent_abi_cxx11_((string *)((long)&ty.field_2 + 8),(pprint *)(ulong)local_24,n);
        ::std::operator<<(aoStack_1a0,(string *)(ty.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(ty.field_2._M_local_buf + 8));
        bVar1 = Property::has_custom((Property *)prop_name_local);
        if (bVar1) {
          ::std::operator<<(aoStack_1a0,"custom ");
        }
        VVar2 = Attribute::variability(this);
        if (VVar2 == Uniform) {
          ::std::operator<<(aoStack_1a0,"uniform ");
        }
        else {
          Attribute::is_varying_authored(this);
        }
        ::std::__cxx11::string::string(local_218);
        Attribute::type_name_abi_cxx11_(&local_238,this);
        ::std::__cxx11::string::operator=(local_218,(string *)&local_238);
        ::std::__cxx11::string::~string((string *)&local_238);
        poVar7 = ::std::operator<<(aoStack_1a0,local_218);
        poVar7 = ::std::operator<<(poVar7," ");
        ::std::operator<<(poVar7,(string *)psStack_20);
        bVar1 = Attribute::has_value(this);
        if (bVar1) {
          ::std::operator<<(aoStack_1a0," = ");
          bVar1 = Attribute::is_blocked(this);
          if (bVar1) {
            ::std::operator<<(aoStack_1a0,"None");
          }
          else {
            pPVar5 = Attribute::get_var(this);
            this_00 = (value *)primvar::PrimVar::value_raw(pPVar5);
            indent = 1;
            value::pprint_value_abi_cxx11_(&local_258,this_00,(Value *)0x0,1,(bool)in_R8B);
            ::std::operator<<(aoStack_1a0,(string *)&local_258);
            ::std::__cxx11::string::~string((string *)&local_258);
          }
        }
        pAVar4 = Property::get_attribute((Property *)prop_name_local);
        pAVar3 = Attribute::metas(pAVar4);
        bVar1 = AttrMetas::authored(pAVar3);
        if (bVar1) {
          poVar7 = ::std::operator<<(aoStack_1a0," (\n");
          pAVar4 = Property::get_attribute((Property *)prop_name_local);
          pAVar3 = Attribute::metas(pAVar4);
          print_attr_metas_abi_cxx11_
                    (&local_278,(tinyusdz *)pAVar3,(AttrMeta *)(ulong)(local_24 + 1),indent);
          poVar7 = ::std::operator<<(poVar7,(string *)&local_278);
          pprint::Indent_abi_cxx11_(&local_298,(pprint *)(ulong)local_24,n_00);
          poVar7 = ::std::operator<<(poVar7,(string *)&local_298);
          ::std::operator<<(poVar7,")");
          ::std::__cxx11::string::~string((string *)&local_298);
          ::std::__cxx11::string::~string((string *)&local_278);
        }
        ::std::operator<<(aoStack_1a0,"\n");
        ::std::__cxx11::string::~string(local_218);
      }
      bVar1 = Attribute::has_timesamples(this);
      if ((bVar1) && (VVar2 = Attribute::variability(this), VVar2 != Uniform)) {
        pprint::Indent_abi_cxx11_
                  ((string *)((long)&ty_1.field_2 + 8),(pprint *)(ulong)local_24,n_01);
        ::std::operator<<(aoStack_1a0,(string *)(ty_1.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(ty_1.field_2._M_local_buf + 8));
        bVar1 = Property::has_custom((Property *)prop_name_local);
        if (bVar1) {
          ::std::operator<<(aoStack_1a0,"custom ");
        }
        ::std::__cxx11::string::string(local_2d8);
        Attribute::type_name_abi_cxx11_(&local_2f8,this);
        ::std::__cxx11::string::operator=(local_2d8,(string *)&local_2f8);
        ::std::__cxx11::string::~string((string *)&local_2f8);
        poVar7 = ::std::operator<<(aoStack_1a0,local_2d8);
        poVar7 = ::std::operator<<(poVar7," ");
        ::std::operator<<(poVar7,(string *)psStack_20);
        ::std::operator<<(aoStack_1a0,".timeSamples");
        ::std::operator<<(aoStack_1a0," = ");
        pPVar5 = Attribute::get_var(this);
        this_01 = primvar::PrimVar::ts_raw(pPVar5);
        print_timesamples_abi_cxx11_
                  (&local_318,(tinyusdz *)this_01,(TimeSamples *)(ulong)local_24,indent);
        ::std::operator<<(aoStack_1a0,(string *)&local_318);
        ::std::__cxx11::string::~string((string *)&local_318);
        ::std::operator<<(aoStack_1a0,"\n");
        ::std::__cxx11::string::~string(local_2d8);
      }
      bVar1 = Attribute::has_connections(this);
      if (bVar1) {
        pprint::Indent_abi_cxx11_
                  ((string *)((long)&ty_2.field_2 + 8),(pprint *)(ulong)local_24,n_02);
        ::std::operator<<(aoStack_1a0,(string *)(ty_2.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(ty_2.field_2._M_local_buf + 8));
        bVar1 = Property::has_custom((Property *)prop_name_local);
        if (bVar1) {
          ::std::operator<<(aoStack_1a0,"custom ");
        }
        VVar2 = Attribute::variability(this);
        if (VVar2 == Uniform) {
          ::std::operator<<(aoStack_1a0,"uniform ");
        }
        else {
          Attribute::is_varying_authored(this);
        }
        ::std::__cxx11::string::string(local_358);
        Attribute::type_name_abi_cxx11_((string *)&paths,this);
        ::std::__cxx11::string::operator=(local_358,(string *)&paths);
        ::std::__cxx11::string::~string((string *)&paths);
        poVar7 = ::std::operator<<(aoStack_1a0,local_358);
        poVar7 = ::std::operator<<(poVar7," ");
        ::std::operator<<(poVar7,(string *)psStack_20);
        ::std::operator<<(aoStack_1a0,".connect = ");
        this_02 = Attribute::connections(this);
        sVar6 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)this_02);
        if (sVar6 == 1) {
          v = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this_02,0);
          ::std::operator<<(aoStack_1a0,v);
        }
        else {
          sVar6 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)this_02);
          if (sVar6 == 0) {
            ::std::operator<<(aoStack_1a0,"[InternalError]");
          }
          else {
            ::std::operator<<(aoStack_1a0,this_02);
          }
        }
        ::std::operator<<(aoStack_1a0,"\n");
        ::std::__cxx11::string::~string(local_358);
      }
    }
    else {
      poVar7 = ::std::operator<<(aoStack_1a0,"[Invalid Property] ");
      poVar7 = ::std::operator<<(poVar7,(string *)psStack_20);
      ::std::operator<<(poVar7,"\n");
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_prop(const Property &prop, const std::string &prop_name,
                       uint32_t indent) {
  std::stringstream ss;

  if (prop.is_relationship()) {
    ss << print_rel_prop(prop, prop_name, indent);

    // Attribute or AttributeConnection
  } else if (prop.is_attribute()) {
    const Attribute &attr = prop.get_attribute();

    //
    // May print multiple times.
    // e.g.
    // float var = 1.0
    // float var.timeSamples = ...
    // float var.connect = <...>
    //
    // timeSamples and connect cannot have attrMeta
    // 

    if (attr.metas().authored() || attr.has_value()) {

      ss << pprint::Indent(indent);

      if (prop.has_custom()) {
        ss << "custom ";
      }

      if (attr.variability() == Variability::Uniform) {
        ss << "uniform ";
      } else if (attr.is_varying_authored()) {
        // For Attribute, `varying` is the default variability and does not shown
        // in USDA do nothing
      }

      std::string ty;

      ty = attr.type_name();
      ss << ty << " " << prop_name;

      if (!attr.has_value()) {
        // Nothing to do
      } else {
        // has value content

        ss << " = ";

        if (attr.is_blocked()) {
          ss << "None";
        } else {
          // default value
          ss << value::pprint_value(attr.get_var().value_raw());
        }
      }

      if (prop.get_attribute().metas().authored()) {
        ss << " (\n"
           << print_attr_metas(prop.get_attribute().metas(), indent + 1)
           << pprint::Indent(indent) << ")";
      }

      ss << "\n";
    }

    if (attr.has_timesamples() && (attr.variability() != Variability::Uniform)) {

      ss << pprint::Indent(indent);

      if (prop.has_custom()) {
        ss << "custom ";
      }

      std::string ty;

      ty = attr.type_name();
      ss << ty << " " << prop_name;

      ss << ".timeSamples";

      ss << " = ";

      ss << print_timesamples(attr.get_var().ts_raw(), indent);

      ss << "\n";
    }

    if (attr.has_connections()) {

      ss << pprint::Indent(indent);

      if (prop.has_custom()) {
        ss << "custom ";
      }

      if (attr.variability() == Variability::Uniform) {
        ss << "uniform ";
      } else if (attr.is_varying_authored()) {
        // For Attribute, `varying` is the default variability and does not shown
        // in USDA do nothing
      }

      std::string ty;

      ty = attr.type_name();
      ss << ty << " " << prop_name;

      ss << ".connect = ";

      const std::vector<Path> &paths = attr.connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  } else {
    ss << "[Invalid Property] " << prop_name << "\n";
  }

  return ss.str();
}